

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void callTMres(lua_State *L,StkId res,TValue *f,TValue *p1,TValue *p2)

{
  int iVar1;
  StkId pTVar2;
  long lVar3;
  int newsize;
  StkId pTVar4;
  
  pTVar4 = L->top;
  pTVar2 = L->stack;
  pTVar4->value = f->value;
  pTVar4->tt = f->tt;
  pTVar4 = L->top;
  pTVar4[1].value = p1->value;
  pTVar4[1].tt = p1->tt;
  pTVar4 = L->top;
  pTVar4[2].value = p2->value;
  pTVar4[2].tt = p2->tt;
  pTVar4 = L->top;
  if ((long)L->stack_last - (long)pTVar4 < 0x31) {
    iVar1 = L->stacksize;
    newsize = iVar1 * 2;
    if (iVar1 < 3) {
      newsize = iVar1 + 3;
    }
    luaD_reallocstack(L,newsize);
    pTVar4 = L->top;
  }
  lVar3 = (long)res - (long)pTVar2;
  L->top = pTVar4 + 3;
  luaD_call(L,pTVar4,1);
  pTVar4 = L->top;
  pTVar2 = L->stack;
  L->top = pTVar4 + -1;
  *(Value *)((long)pTVar2 + lVar3) = pTVar4[-1].value;
  *(int *)((long)pTVar2 + lVar3 + 8) = pTVar4[-1].tt;
  return;
}

Assistant:

static void callTMres(lua_State*L,StkId res,const TValue*f,
const TValue*p1,const TValue*p2){
ptrdiff_t result=savestack(L,res);
setobj(L,L->top,f);
setobj(L,L->top+1,p1);
setobj(L,L->top+2,p2);
luaD_checkstack(L,3);
L->top+=3;
luaD_call(L,L->top-3,1);
res=restorestack(L,result);
L->top--;
setobj(L,res,L->top);
}